

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

void co_set_env_list(char **name,size_t cnt)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  size_t sVar9;
  long lVar10;
  undefined8 *puVar11;
  
  if (_ZL11g_co_sysenv_0 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)calloc(1,cnt << 4);
    _ZL11g_co_sysenv_0 = puVar4;
    if (cnt != 0) {
      sVar9 = 0;
      uVar6 = _ZL11g_co_sysenv_1;
      do {
        pcVar5 = name[sVar9];
        uVar7 = uVar6;
        if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
          pcVar5 = strdup(pcVar5);
          uVar7 = uVar6 + 1;
          _ZL11g_co_sysenv_1 = uVar7;
          puVar4[uVar6 * 2] = pcVar5;
        }
        sVar9 = sVar9 + 1;
        uVar6 = uVar7;
      } while (cnt != sVar9);
    }
    if (1 < _ZL11g_co_sysenv_1) {
      qsort(puVar4,_ZL11g_co_sysenv_1,0x10,co_sysenv_comp);
      puVar2 = _ZL11g_co_sysenv_0;
      puVar4 = _ZL11g_co_sysenv_0;
      if (1 < _ZL11g_co_sysenv_1) {
        lVar10 = _ZL11g_co_sysenv_1 - 1;
        puVar8 = _ZL11g_co_sysenv_0;
        puVar11 = _ZL11g_co_sysenv_0;
        do {
          iVar3 = strcmp((char *)*puVar8,(char *)puVar11[2]);
          puVar4 = puVar8;
          if ((iVar3 != 0) && (puVar4 = puVar8 + 2, puVar11 != puVar8)) {
            uVar1 = puVar11[3];
            *puVar4 = puVar11[2];
            puVar8[3] = uVar1;
          }
          lVar10 = lVar10 + -1;
          puVar8 = puVar4;
          puVar11 = puVar11 + 2;
        } while (lVar10 != 0);
      }
      _ZL11g_co_sysenv_1 = ((long)puVar4 - (long)puVar2 >> 4) + 1;
    }
    return;
  }
  return;
}

Assistant:

void co_set_env_list( const char *name[],size_t cnt)
{
	if( g_co_sysenv.data )
	{
		return ;
	}
	g_co_sysenv.data = (stCoSysEnv_t*)calloc( 1,sizeof(stCoSysEnv_t) * cnt  );

	for(size_t i=0;i<cnt;i++)
	{
		if( name[i] && name[i][0] )
		{
			g_co_sysenv.data[ g_co_sysenv.cnt++ ].name = strdup( name[i] );
		}
	}
	if( g_co_sysenv.cnt > 1 )
	{
		qsort( g_co_sysenv.data,g_co_sysenv.cnt,sizeof(stCoSysEnv_t),co_sysenv_comp );
		stCoSysEnv_t *lp = g_co_sysenv.data;
		stCoSysEnv_t *lq = g_co_sysenv.data + 1;
		for(size_t i=1;i<g_co_sysenv.cnt;i++)
		{
			if( strcmp( lp->name,lq->name ) )
			{
				++lp;
				if( lq != lp  )
				{
					*lp = *lq;
				}
			}
			++lq;
		}
		g_co_sysenv.cnt = lp - g_co_sysenv.data + 1;
	}

}